

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::readMemories(WasmBinaryReader *this)

{
  uint32_t uVar1;
  ostream *poVar2;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *puVar3;
  __node_base *p_Var4;
  long lVar5;
  size_t counter;
  Name NVar6;
  Name name;
  Name name_00;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *in_stack_ffffffffffffff38;
  string local_b8;
  undefined1 local_98 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  Address local_58;
  undefined1 local_50;
  long local_38;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  
  uVar1 = getU32LEB(this);
  lVar5 = (long)(this->wasm->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->wasm->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_98 = (undefined1  [8])&usedNames._M_h._M_rehash_policy._M_next_resize;
  usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedNames._M_h._M_bucket_count = 0;
  usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedNames._M_h._M_rehash_policy._4_4_ = 0;
  usedNames._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var4 = &(this->memoryNames)._M_h._M_before_begin;
  puVar3 = &this->memoryNames;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    if (lVar5 + (ulong)uVar1 <= (ulong)(uint)*(size_type *)(p_Var4 + 1)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "warning: memory index out of bounds in name section: ");
      name_00.super_IString.str._M_str = (char *)puVar3;
      name_00.super_IString.str._M_len = (size_t)p_Var4[3]._M_nxt;
      poVar2 = wasm::operator<<((wasm *)poVar2,
                                *(ostream **)
                                 &((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor,name_00
                               );
      poVar2 = std::operator<<(poVar2," at index ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,'\n');
    }
    std::__detail::
    _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_98,(value_type *)(p_Var4 + 2));
  }
  for (counter = 0; uVar1 != counter; counter = counter + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"",(allocator<char> *)&local_38);
    NVar6 = makeName(&local_b8,counter);
    name.super_IString.str._M_str = local_98;
    name.super_IString.str._M_len = (size_t)NVar6.super_IString.str._M_str;
    getOrMakeName((pair<wasm::Name,_bool> *)&usedNames._M_h._M_single_bucket,
                  (wasm *)&this->memoryNames,
                  (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   *)(lVar5 + counter),(Index)NVar6.super_IString.str._M_len,name,
                  in_stack_ffffffffffffff38);
    std::__cxx11::string::~string((string *)&local_b8);
    in_stack_ffffffffffffff38 =
         (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          *)0x2;
    NVar6.super_IString.str._M_str = (char *)usedNames._M_h._M_single_bucket;
    NVar6.super_IString.str._M_len = (size_t)&local_38;
    Builder::makeMemory(NVar6,local_58,(Address)0x0,false,(Type)0x0);
    *(undefined1 *)(local_38 + 0x10) = local_50;
    getResizableLimits(this,(Address *)(local_38 + 0x38),(Address *)(local_38 + 0x40),
                       (bool *)(local_38 + 0x48),(Type *)(local_38 + 0x50),
                       (Address)0xffffffffffffffff);
    Module::addMemory(this->wasm,
                      (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_38);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
              ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_38);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_98);
  return;
}

Assistant:

void WasmBinaryReader::readMemories() {
  auto num = getU32LEB();
  auto numImports = wasm.memories.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : memoryNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: memory index out of bounds in name section: "
                << name << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    auto [name, isExplicit] =
      getOrMakeName(memoryNames, numImports + i, makeName("", i), usedNames);
    auto memory = Builder::makeMemory(name);
    memory->hasExplicitName = isExplicit;
    getResizableLimits(memory->initial,
                       memory->max,
                       memory->shared,
                       memory->addressType,
                       Memory::kUnlimitedSize);
    wasm.addMemory(std::move(memory));
  }
}